

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg_tools.cxx
# Opt level: O2

int write_prelim_header(OggVorbis_File *vf,FILE *out,int64_t knownlength)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  vorbis_info *pvVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  
  pvVar5 = ov_info(vf,0);
  uVar2 = pvVar5->channels;
  pvVar5 = ov_info(vf,0);
  lVar3 = pvVar5->rate;
  uVar9 = (int)lVar3 * uVar2;
  iVar10 = 0x7fffffff;
  if ((knownlength != 0) && (lVar4 = knownlength * (int)uVar2 * 2, lVar4 < 0x7fffffff)) {
    iVar10 = (int)lVar4 + 0x2c;
  }
  builtin_memcpy(headbuf,"RIFF",4);
  iVar1 = iVar10 + -8;
  headbuf[4] = (uchar)iVar1;
  headbuf[5] = (uchar)((uint)iVar1 >> 8);
  headbuf[6] = (uchar)((uint)iVar1 >> 0x10);
  headbuf[7] = (uchar)((uint)iVar1 >> 0x18);
  builtin_memcpy(headbuf + 8,"WAVEfmt \x10",10);
  headbuf[0x12] = '\0';
  headbuf[0x13] = '\0';
  headbuf[0x14] = '\x01';
  headbuf[0x15] = '\0';
  headbuf[0x16] = (uchar)uVar2;
  headbuf[0x17] = (uchar)(uVar2 >> 8);
  headbuf[0x18] = (uchar)lVar3;
  headbuf[0x19] = (uchar)((ulong)lVar3 >> 8);
  headbuf[0x1a] = (uchar)((ulong)lVar3 >> 0x10);
  headbuf[0x1b] = (uchar)((ulong)lVar3 >> 0x18);
  headbuf[0x1c] = (char)uVar9 * '\x02';
  headbuf[0x1d] = (uchar)(uVar9 >> 7);
  headbuf[0x1e] = (uchar)(uVar9 >> 0xf);
  headbuf[0x1f] = (uchar)(uVar9 >> 0x17);
  headbuf[0x20] = headbuf[0x16] * '\x02';
  headbuf[0x21] = (uchar)(uVar2 >> 7);
  headbuf[0x22] = '\x10';
  headbuf[0x23] = '\0';
  headbuf[0x24] = 'd';
  headbuf[0x25] = 'a';
  headbuf[0x26] = 't';
  headbuf[0x27] = 'a';
  iVar10 = iVar10 + -0x2c;
  headbuf[0x28] = (uchar)iVar10;
  headbuf[0x29] = (uchar)((uint)iVar10 >> 8);
  headbuf[0x2a] = (uchar)((uint)iVar10 >> 0x10);
  headbuf[0x2b] = (uchar)((uint)iVar10 >> 0x18);
  sVar6 = fwrite(headbuf,1,0x2c,(FILE *)out);
  if (sVar6 != 0x2c) {
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    xray_re::msg("ERROR: Failed to write Wave header: %s",pcVar8);
  }
  return (uint)(sVar6 != 0x2c);
}

Assistant:

int write_prelim_header(OggVorbis_File *vf, FILE *out, int64_t knownlength) {
	unsigned int size = 0x7fffffff;
	int channels = ov_info(vf,0)->channels;
	int samplerate = ov_info(vf,0)->rate;
	int bytespersec = channels*samplerate*bits/8;
	int align = channels*bits/8;
	int samplesize = bits;

	if(knownlength && knownlength*bits/8*channels < size)
		size = (unsigned int)(knownlength*bits/8*channels+44) ;

	memcpy(headbuf, "RIFF", 4);
	WRITE_U32(headbuf+4, size-8);
	memcpy(headbuf+8, "WAVE", 4);
	memcpy(headbuf+12, "fmt ", 4);
	WRITE_U32(headbuf+16, 16);
	WRITE_U16(headbuf+20, 1); /* format */
	WRITE_U16(headbuf+22, channels);
	WRITE_U32(headbuf+24, samplerate);
	WRITE_U32(headbuf+28, bytespersec);
	WRITE_U16(headbuf+32, align);
	WRITE_U16(headbuf+34, samplesize);
	memcpy(headbuf+36, "data", 4);
	WRITE_U32(headbuf+40, size - 44);

	if(fwrite(headbuf, 1, 44, out) != 44) {
		msg("ERROR: Failed to write Wave header: %s", strerror(errno));
		return 1;
	}

	return 0;
}